

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O0

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitCallIndirect
          (SubtypingDiscoverer<NullFixer> *this,CallIndirect *curr)

{
  bool bVar1;
  NullFixer *pNVar2;
  Module *this_00;
  Table *pTVar3;
  HeapType left;
  Signature sig;
  HeapType tableType;
  Table *table;
  CallIndirect *curr_local;
  SubtypingDiscoverer<NullFixer> *this_local;
  
  sig = HeapType::getSignature(&curr->heapType);
  handleCall<wasm::CallIndirect>(this,curr,sig);
  pNVar2 = self(this);
  this_00 = Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>::getModule
                      ((Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_> *)
                       &(pNVar2->
                        super_WalkerPass<wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>_>
                        ).super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>)
  ;
  pTVar3 = Module::getTable(this_00,(Name)(curr->table).super_IString.str);
  left = wasm::Type::getHeapType(&pTVar3->type);
  bVar1 = HeapType::isSubType(left,(HeapType)(curr->heapType).id);
  if (bVar1) {
    pNVar2 = self(this);
    StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::HeapType,wasm::
    HeapType_(pNVar2,left,(HeapType)(curr->heapType).id);
  }
  else {
    bVar1 = HeapType::isSubType((HeapType)(curr->heapType).id,left);
    if (bVar1) {
      pNVar2 = self(this);
      StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteCast(wasm::HeapType,wasm::
      HeapType_(pNVar2,left,(HeapType)(curr->heapType).id);
    }
  }
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    handleCall(curr, curr->heapType.getSignature());
    auto* table = self()->getModule()->getTable(curr->table);
    auto tableType = table->type.getHeapType();
    if (HeapType::isSubType(tableType, curr->heapType)) {
      // Unlike other casts, where cast targets are always subtypes of cast
      // sources, call_indirect target types may be supertypes of their source
      // table types. In this case, the cast will always succeed, but only if we
      // keep the types related.
      // TODO: No value flows here, so we could use |noteNonFlowSubtype|, but
      //       this is a trivial situation that is not worth optimizing.
      self()->noteSubtype(tableType, curr->heapType);
    } else if (HeapType::isSubType(curr->heapType, tableType)) {
      self()->noteCast(tableType, curr->heapType);
    } else {
      // The types are unrelated and the cast will fail. We can keep the types
      // unrelated.
    }
  }